

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

void __thiscall gui::Slider::updateThumb(Slider *this,float thumbPosition)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = getThumbWidth(this);
  fVar1 = (this->range_).first;
  fVar4 = (fVar2 * -0.5 + thumbPosition) / ((this->size_).x - fVar2);
  fVar2 = 0.0;
  if (0.0 <= fVar4) {
    fVar2 = fVar4;
  }
  fVar4 = 1.0;
  if (fVar2 <= 1.0) {
    fVar4 = fVar2;
  }
  fVar2 = this->step_;
  fVar3 = (this->range_).second - fVar1;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar3 = floorf(fVar3 / fVar2);
    fVar3 = roundf((fVar3 + 1.0 + -1.0) * fVar4);
    fVar3 = fVar3 * fVar2;
  }
  else {
    fVar3 = fVar3 * fVar4;
  }
  setValue(this,fVar3 + fVar1);
  return;
}

Assistant:

void Slider::updateThumb(float thumbPosition) {
    const float thumbWidth = getThumbWidth();
    const float thumbNormalized = std::min(std::max((thumbPosition - 0.5f * thumbWidth) / (size_.x - thumbWidth), 0.0f), 1.0f);

    if (step_ == 0.0f) {
        setValue((range_.second - range_.first) * thumbNormalized + range_.first);
    } else {
        float numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
        setValue(std::round(thumbNormalized * (numThumbPositions - 1.0f)) * step_ + range_.first);
    }
}